

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ssl_add_flags_extension(CBB *cbb,SSLFlags flags)

{
  int iVar1;
  CBB child;
  CBB body;
  
  if (flags == 0) {
    return true;
  }
  iVar1 = CBB_add_u16(cbb,0x3e);
  if ((iVar1 != 0) && (iVar1 = CBB_add_u16_length_prefixed(cbb,&body), iVar1 != 0)) {
    iVar1 = CBB_add_u8_length_prefixed(&body,&child);
    while (iVar1 != 0) {
      if (flags == 0) {
        iVar1 = CBB_flush(cbb);
        return iVar1 != 0;
      }
      iVar1 = CBB_add_u8(&child,(uint8_t)flags);
      flags = flags >> 8;
    }
  }
  return false;
}

Assistant:

bool ssl_add_flags_extension(CBB *cbb, SSLFlags flags) {
  if (flags == 0) {
    return true;
  }

  CBB body, child;
  if (!CBB_add_u16(cbb, TLSEXT_TYPE_tls_flags) ||
      !CBB_add_u16_length_prefixed(cbb, &body) ||
      !CBB_add_u8_length_prefixed(&body, &child)) {
    return false;
  }

  while (flags != 0) {
    if (!CBB_add_u8(&child, static_cast<uint8_t>(flags))) {
      return false;
    }
    flags >>= 8;
  }

  return CBB_flush(cbb);
}